

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O2

int MRIStepInnerStepper_SetFullRhsFn(MRIStepInnerStepper stepper,MRIStepInnerFullRhsFn fn)

{
  char *msgfmt;
  
  if (stepper == (MRIStepInnerStepper)0x0) {
    msgfmt = "Inner stepper memory is NULL";
  }
  else {
    if (stepper->ops != (MRIStepInnerStepper_Ops)0x0) {
      stepper->ops->fullrhs = fn;
      return 0;
    }
    msgfmt = "Inner stepper operations structure is NULL";
  }
  arkProcessError((ARKodeMem)0x0,-0x16,"ARKode::MRIStep","MRIStepInnerStepper_SetFullRhsFn",msgfmt);
  return -0x16;
}

Assistant:

int MRIStepInnerStepper_SetFullRhsFn(MRIStepInnerStepper stepper,
                                     MRIStepInnerFullRhsFn fn)
{
  if (stepper == NULL)
  {
    arkProcessError(NULL, ARK_ILL_INPUT, "ARKode::MRIStep",
                    "MRIStepInnerStepper_SetFullRhsFn",
                    "Inner stepper memory is NULL");
    return ARK_ILL_INPUT;
  }

  if (stepper->ops == NULL)
  {
    arkProcessError(NULL, ARK_ILL_INPUT, "ARKode::MRIStep",
                    "MRIStepInnerStepper_SetFullRhsFn",
                    "Inner stepper operations structure is NULL");
    return ARK_ILL_INPUT;
  }

  stepper->ops->fullrhs = fn;

  return ARK_SUCCESS;
}